

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio.c
# Opt level: O1

_Bool do_install_audio(ALLEGRO_AUDIO_DRIVER_ENUM mode)

{
  undefined1 uVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  
  if (_al_kcm_driver != (ALLEGRO_AUDIO_DRIVER *)0x0) {
    _al_set_error(0xff,"A driver already running");
    return false;
  }
  if (mode == ALLEGRO_AUDIO_DRIVER_AUTODETECT) {
    uVar3 = al_get_system_config();
    pcVar4 = (char *)al_get_config_value(uVar3,"audio","driver");
    mode = ALLEGRO_AUDIO_DRIVER_AUTODETECT;
    if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
      iVar2 = _al_stricmp(pcVar4,"ALSA");
      if (iVar2 == 0) {
        mode = ALLEGRO_AUDIO_DRIVER_ALSA;
      }
      else {
        iVar2 = _al_stricmp(pcVar4,"OPENAL");
        if (iVar2 == 0) {
          mode = ALLEGRO_AUDIO_DRIVER_OPENAL;
        }
        else {
          iVar2 = _al_stricmp(pcVar4,"OPENSL");
          if (iVar2 == 0) {
            mode = ALLEGRO_AUDIO_DRIVER_OPENSL;
          }
          else {
            iVar2 = _al_stricmp(pcVar4,"OSS");
            if (iVar2 == 0) {
              mode = ALLEGRO_AUDIO_DRIVER_OSS;
            }
            else {
              iVar2 = _al_stricmp(pcVar4,"PULSEAUDIO");
              if (iVar2 == 0) {
                mode = ALLEGRO_AUDIO_DRIVER_PULSEAUDIO;
              }
              else {
                iVar2 = _al_stricmp(pcVar4,"DSOUND");
                if (iVar2 == 0) {
                  mode = ALLEGRO_AUDIO_DRIVER_DSOUND;
                }
                else {
                  iVar2 = _al_stricmp(pcVar4,"DIRECTSOUND");
                  mode = (uint)(iVar2 == 0) * 3 + ALLEGRO_AUDIO_DRIVER_AUTODETECT;
                }
              }
            }
          }
        }
      }
    }
  }
  uVar1 = (*(code *)((long)&DAT_001120ac +
                    (long)(int)(&DAT_001120ac)[mode - ALLEGRO_AUDIO_DRIVER_AUTODETECT]))();
  return (_Bool)uVar1;
}

Assistant:

static bool do_install_audio(ALLEGRO_AUDIO_DRIVER_ENUM mode)
{
   bool retVal;

   /* check to see if a driver is already installed and running */
   if (_al_kcm_driver) {
      _al_set_error(ALLEGRO_GENERIC_ERROR, "A driver already running");
      return false;
   }

   if (mode == ALLEGRO_AUDIO_DRIVER_AUTODETECT) {
      mode = get_config_audio_driver();
   }

   switch (mode) {
      case ALLEGRO_AUDIO_DRIVER_AUTODETECT:
#if defined(ALLEGRO_SDL)
         retVal = do_install_audio(ALLEGRO_AUDIO_DRIVER_SDL);
         if (retVal)
            return retVal;
#endif
#if defined(ALLEGRO_CFG_KCM_AQUEUE)
         retVal = do_install_audio(ALLEGRO_AUDIO_DRIVER_AQUEUE);
         if (retVal)
            return retVal;
#endif
/* If a PA server is running, we should use it by default as it will
 * hijack ALSA and OSS and using those then just means extra lag.
 * 
 * FIXME: Detect if no PA server is running and in that case prefer
 * ALSA and OSS first.
 */
#if defined(ALLEGRO_CFG_KCM_PULSEAUDIO)
         retVal = do_install_audio(ALLEGRO_AUDIO_DRIVER_PULSEAUDIO);
         if (retVal)
            return retVal;
#endif
#if defined(ALLEGRO_CFG_KCM_ALSA)
         retVal = do_install_audio(ALLEGRO_AUDIO_DRIVER_ALSA);
         if (retVal)
            return retVal;
#endif
#if defined(ALLEGRO_CFG_KCM_DSOUND)
         retVal = do_install_audio(ALLEGRO_AUDIO_DRIVER_DSOUND);
         if (retVal)
            return retVal;
#endif
#if defined(ALLEGRO_CFG_KCM_OSS)
         retVal = do_install_audio(ALLEGRO_AUDIO_DRIVER_OSS);
         if (retVal)
            return retVal;
#endif
#if defined(ALLEGRO_CFG_KCM_OPENAL)
         retVal = do_install_audio(ALLEGRO_AUDIO_DRIVER_OPENAL);
         if (retVal)
            return retVal;
#endif
#if defined(ALLEGRO_CFG_KCM_OPENSL)
         retVal = do_install_audio(ALLEGRO_AUDIO_DRIVER_OPENSL);
         if (retVal)
            return retVal;
#endif

         _al_set_error(ALLEGRO_INVALID_PARAM, "No audio driver can be used.");
         _al_kcm_driver = NULL;
         return false;

      case ALLEGRO_AUDIO_DRIVER_AQUEUE:
         #if defined(ALLEGRO_CFG_KCM_AQUEUE)
            if (_al_kcm_aqueue_driver.open() == 0) {
               ALLEGRO_INFO("Using Apple Audio Queue driver\n"); 
               _al_kcm_driver = &_al_kcm_aqueue_driver;
               return true;
            }
            return false;
         #else
            _al_set_error(ALLEGRO_INVALID_PARAM, "Audio Queue driver not available on this platform");
            return false;
         #endif

      case ALLEGRO_AUDIO_DRIVER_OPENAL:
         #if defined(ALLEGRO_CFG_KCM_OPENAL)
            if (_al_kcm_openal_driver.open() == 0) {
               ALLEGRO_INFO("Using OpenAL driver\n"); 
               _al_kcm_driver = &_al_kcm_openal_driver;
               return true;
            }
            return false;
         #else
            _al_set_error(ALLEGRO_INVALID_PARAM, "OpenAL not available on this platform");
            return false;
         #endif

      case ALLEGRO_AUDIO_DRIVER_OPENSL:
         #if defined(ALLEGRO_CFG_KCM_OPENSL)
            if (_al_kcm_opensl_driver.open() == 0) {
               ALLEGRO_INFO("Using OpenSL driver\n"); 
               _al_kcm_driver = &_al_kcm_opensl_driver;
               return true;
            }
            return false;
         #else
            _al_set_error(ALLEGRO_INVALID_PARAM, "OpenSL not available on this platform");
            return false;
         #endif

      case ALLEGRO_AUDIO_DRIVER_ALSA:
         #if defined(ALLEGRO_CFG_KCM_ALSA)
            if (_al_kcm_alsa_driver.open() == 0) {
               ALLEGRO_INFO("Using ALSA driver\n"); 
               _al_kcm_driver = &_al_kcm_alsa_driver;
               return true;
            }
            return false;
         #else
            _al_set_error(ALLEGRO_INVALID_PARAM, "ALSA not available on this platform");
            return false;
         #endif

      case ALLEGRO_AUDIO_DRIVER_OSS:
         #if defined(ALLEGRO_CFG_KCM_OSS)
            if (_al_kcm_oss_driver.open() == 0) {
               ALLEGRO_INFO("Using OSS driver\n");
               _al_kcm_driver = &_al_kcm_oss_driver;
               return true;
            }
            return false;
         #else
            _al_set_error(ALLEGRO_INVALID_PARAM, "OSS not available on this platform");
            return false;
         #endif

      case ALLEGRO_AUDIO_DRIVER_PULSEAUDIO:
         #if defined(ALLEGRO_CFG_KCM_PULSEAUDIO)
            if (_al_kcm_pulseaudio_driver.open() == 0) {
               ALLEGRO_INFO("Using PulseAudio driver\n");
               _al_kcm_driver = &_al_kcm_pulseaudio_driver;
               return true;
            }
            return false;
         #else
            _al_set_error(ALLEGRO_INVALID_PARAM, "PulseAudio not available on this platform");
            return false;
         #endif

      case ALLEGRO_AUDIO_DRIVER_DSOUND:
         #if defined(ALLEGRO_CFG_KCM_DSOUND)
            if (_al_kcm_dsound_driver.open() == 0) {
               ALLEGRO_INFO("Using DirectSound driver\n"); 
               _al_kcm_driver = &_al_kcm_dsound_driver;
               return true;
            }
            return false;
         #else
            _al_set_error(ALLEGRO_INVALID_PARAM, "DirectSound not available on this platform");
            return false;
         #endif

      case ALLEGRO_AUDIO_DRIVER_SDL:
         #if defined(ALLEGRO_SDL)
            if (_al_kcm_sdl_driver.open() == 0) {
               ALLEGRO_INFO("Using SDL driver\n");
               _al_kcm_driver = &_al_kcm_sdl_driver;
               return true;
            }
            return false;
         #else
            _al_set_error(ALLEGRO_INVALID_PARAM, "SDL not available on this platform");
            return false;
         #endif

      default:
         _al_set_error(ALLEGRO_INVALID_PARAM, "Invalid audio driver");
         return false;
   }
}